

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O2

void __thiscall llvm::DWARFGdbIndex::dumpCUList(DWARFGdbIndex *this,raw_ostream *OS)

{
  undefined1 auVar1 [16];
  uint uVar2;
  void *pvVar3;
  undefined8 uVar4;
  raw_ostream *this_00;
  int iVar5;
  long lVar6;
  format_object_base local_60;
  undefined1 local_50 [16];
  int local_40;
  raw_ostream *local_38;
  
  uVar4 = local_50._0_8_;
  local_50._4_4_ = 0;
  local_50._0_4_ =
       (this->CuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>.
       super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>.
       super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>.
       super_SmallVectorBase.Size;
  local_60.Fmt = "\n  CU list offset = 0x%x, has %ld entries:";
  local_60._vptr_format_object_base = (_func_int **)&PTR_home_01127d90;
  local_50._12_4_ = SUB84(uVar4,4);
  local_50._8_4_ = this->CuListOffset;
  local_38 = OS;
  this_00 = raw_ostream::operator<<(OS,&local_60);
  raw_ostream::operator<<(this_00,'\n');
  pvVar3 = (this->CuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>.
           super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>.
           super_SmallVectorBase.BeginX;
  uVar2 = (this->CuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>.
          super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>.
          super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>.
          super_SmallVectorBase.Size;
  local_40 = 0;
  for (lVar6 = 0; (ulong)uVar2 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
    local_60.Fmt = "    %d: Offset = 0x%llx, Length = 0x%llx\n";
    local_60._vptr_format_object_base = (_func_int **)&PTR_home_01128628;
    auVar1 = *(undefined1 (*) [16])((long)pvVar3 + lVar6);
    local_50._0_8_ = auVar1._8_8_;
    local_50._8_4_ = auVar1._0_4_;
    local_50._12_4_ = auVar1._4_4_;
    iVar5 = local_40 + 1;
    raw_ostream::operator<<(local_38,&local_60);
    local_40 = iVar5;
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpCUList(raw_ostream &OS) const {
  OS << format("\n  CU list offset = 0x%x, has %" PRId64 " entries:",
               CuListOffset, (uint64_t)CuList.size())
     << '\n';
  uint32_t I = 0;
  for (const CompUnitEntry &CU : CuList)
    OS << format("    %d: Offset = 0x%llx, Length = 0x%llx\n", I++, CU.Offset,
                 CU.Length);
}